

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixCorotation.cpp
# Opt level: O2

void chrono::fea::ChMatrixCorotation::ComputeCK
               (ChMatrixConstRef K,ChMatrix33<double> *R,int nblocks,ChMatrixRef *CK)

{
  double dVar1;
  undefined1 auVar2 [16];
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  ulong uVar5;
  long lVar6;
  int col;
  long col_00;
  int colres;
  long col_01;
  int row;
  long row_00;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  Scalar local_60;
  undefined1 extraout_var [56];
  
  lVar6 = 0;
  for (uVar5 = 0; uVar5 != (uint)(~(nblocks >> 0x1f) & nblocks); uVar5 = uVar5 + 1) {
    for (col_01 = 0;
        col_01 < (int)(K->
                      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_cols.m_value; col_01 = col_01 + 1) {
      for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
        col_00 = 0;
        local_60 = 0.0;
        while (col_00 != 3) {
          pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> *)R,row_00,
                              col_00);
          dVar1 = *pdVar3;
          auVar7._0_8_ = Eigen::
                         DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_0>
                         ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                       *)K,lVar6 + col_00,col_01);
          auVar7._8_56_ = extraout_var;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_60;
          col_00 = col_00 + 1;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = dVar1;
          auVar2 = vfmadd231sd_fma(auVar8,auVar7._0_16_,auVar2);
          local_60 = auVar2._0_8_;
        }
        pSVar4 = Eigen::
                 DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                               *)CK,row_00 + uVar5 * 3,col_01);
        *pSVar4 = local_60;
      }
    }
    lVar6 = lVar6 + 3;
  }
  return;
}

Assistant:

void ChMatrixCorotation::ComputeCK(ChMatrixConstRef K,     // matrix to corotate
                                   const ChMatrix33<>& R,  // 3x3 rotation matrix
                                   const int nblocks,      // number of rotation blocks
                                   ChMatrixRef CK          // result matrix: C*K
) {
    for (int iblock = 0; iblock < nblocks; iblock++) {
        double sum;
        for (int colres = 0; colres < (int)K.cols(); ++colres)
            for (int row = 0; row < 3; ++row) {
                sum = 0;
                for (int col = 0; col < 3; ++col)
                    sum += R(row, col) * K((3 * iblock) + col, colres);
                CK((3 * iblock) + row, colres) = sum;
            }
    }
}